

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O2

void ODDLParser::logInvalidTokenError(char *in,string *exp,logCallback callback)

{
  ostream *poVar1;
  string part;
  string local_1e8;
  string full;
  stringstream stream;
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  poVar1 = std::operator<<(local_198,"Invalid token \"");
  poVar1 = std::operator<<(poVar1,*in);
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1," expected \"");
  poVar1 = std::operator<<(poVar1,(string *)exp);
  poVar1 = std::operator<<(poVar1,"\"");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&full,in,(allocator<char> *)&part);
  std::__cxx11::string::substr((ulong)&part,(ulong)&full);
  std::operator<<(local_198,(string *)&part);
  std::__cxx11::stringbuf::str();
  (*callback)(ddl_error_msg,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&part);
  std::__cxx11::string::~string((string *)&full);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return;
}

Assistant:

static void logInvalidTokenError( char *in, const std::string &exp, OpenDDLParser::logCallback callback ) {
    std::stringstream stream;
    stream << "Invalid token \"" << *in << "\"" << " expected \"" << exp << "\"" << std::endl;
    std::string full( in );
    std::string part( full.substr( 0, 50 ) );
    stream << part;
    callback( ddl_error_msg, stream.str() );
}